

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_Normalize_Test::Body(iu_FilePath_x_iutest_x_Normalize_Test *this)

{
  bool bVar1;
  char *message;
  iuFilePath *in_R9;
  AssertionHelper local_220;
  Fixed local_1f0;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_Normalize_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30,"path//to///dir////file.txt");
  iutest::detail::AlwaysZero();
  iutest::internal::backward::EqHelper<false>::Compare<char[21],iutest::detail::iuFilePath>
            ((AssertionResult *)local_68,(EqHelper<false> *)"\"path/to/dir/file.txt\"","path",
             "path/to/dir/file.txt",(char (*) [21])local_30,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    message = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xe2,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  return;
}

Assistant:

IUTEST(FilePath, Normalize)
{
    ::iutest::internal::FilePath path("path//to///dir////file.txt");
#ifdef IUTEST_OS_WINDOWS
    IUTEST_EXPECT_EQ("path\\to\\dir\\file.txt", path);
#else
    IUTEST_EXPECT_EQ("path/to/dir/file.txt", path);
#endif
}